

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O2

void __thiscall aalcalc::do_calc_end(aalcalc *this,int period_no)

{
  int iVar1;
  size_t sVar2;
  pointer paVar3;
  pointer paVar4;
  pointer pdVar5;
  double dVar6;
  _Rb_tree_color _Var7;
  iterator iVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  pointer pdVar12;
  _Base_ptr p_Var13;
  _Rb_tree_color _Var14;
  int sidx;
  ulong uVar15;
  _Self __tmp;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  int period_no_local;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  sVar2 = (this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  period_no_local = period_no;
  if (sVar2 == 0) {
    local_88 = 1.0;
    dStack_80 = 0.0;
  }
  else {
    iVar8 = std::
            _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
            ::find(&(this->periodstoweighting_)._M_t,&period_no_local);
    if ((_Rb_tree_header *)iVar8._M_node ==
        &(this->periodstoweighting_)._M_t._M_impl.super__Rb_tree_header) {
      local_88 = 0.0;
      dStack_80 = 0.0;
    }
    else {
      auVar17._8_4_ = (int)(sVar2 >> 0x20);
      auVar17._0_8_ = sVar2;
      auVar17._12_4_ = 0x45300000;
      dStack_80 = auVar17._8_8_ - 1.9342813113834067e+25;
      local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
      pmVar9 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[](&this->periodstoweighting_,&period_no_local);
      local_88 = local_88 * *pmVar9;
    }
  }
  paVar3 = (this->vec_analytical_aal_).super__Vector_base<aal_rec,_std::allocator<aal_rec>_>._M_impl
           .super__Vector_impl_data._M_start;
  dVar18 = *(this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start;
  iVar1 = this->current_summary_id_;
  paVar3[iVar1].type = 1;
  paVar3[iVar1].summary_id = iVar1;
  dVar20 = (&paVar3[iVar1].mean)[1];
  paVar3[iVar1].mean = dVar18 * local_88 + paVar3[iVar1].mean;
  (&paVar3[iVar1].mean)[1] = dVar18 * dVar18 * local_88 + dVar20;
  local_58 = local_88;
  dStack_50 = local_88;
  pmVar10 = std::
            map<int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<aal_rec_period,_std::allocator<aal_rec_period>_>_>_>_>
            ::operator[](&this->vec_sample_aal_,&this->samplesize_);
  iVar1 = this->current_summary_id_;
  paVar4 = (pmVar10->super__Vector_base<aal_rec_period,_std::allocator<aal_rec_period>_>)._M_impl.
           super__Vector_impl_data._M_start;
  paVar4[iVar1].super_aal_rec.type = 2;
  _Var7 = this->samplesize_;
  _Var14 = _Var7;
  if (_Var7 != _S_red) {
    _Var14 = this->current_summary_id_;
  }
  paVar4[iVar1].super_aal_rec.summary_id = _Var14;
  p_Var11 = (this->vec_sample_aal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = 0.0;
  uStack_70 = 0;
  uVar15 = 1;
  dVar18 = local_88;
  while ((int)uVar15 <= (int)_Var7) {
    while( true ) {
      _Var14 = p_Var11[1]._M_color;
      if (_Var14 == _Var7) break;
      p_Var13 = p_Var11[1]._M_parent + this->current_summary_id_;
      dVar20 = 0.0;
      for (uVar15 = (ulong)(int)_Var14; (long)uVar15 < (long)(int)(_Var14 * 2); uVar15 = uVar15 + 1)
      {
        dVar16 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar15];
        *(undefined4 *)&p_Var13->field_0x4 = 2;
        p_Var13->_M_color = this->current_summary_id_;
        dVar19 = dVar16 * dVar16 * dStack_50;
        p_Var13->_M_parent = (_Base_ptr)((double)p_Var13->_M_parent + dVar16 * local_58);
        p_Var13->_M_left = (_Base_ptr)((double)p_Var13->_M_left + dVar19);
        dVar6 = paVar4[iVar1].super_aal_rec.mean_squared;
        paVar4[iVar1].super_aal_rec.mean = paVar4[iVar1].super_aal_rec.mean + dVar16 * local_58;
        paVar4[iVar1].super_aal_rec.mean_squared = dVar6 + dVar19;
        if ((this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uStack_40 = 0;
          local_68 = dVar20;
          local_48 = dVar16;
          fillensemblerec(this,(int)uVar15,dVar16,dVar18);
          _Var14 = p_Var11[1]._M_color;
          dVar18 = local_88;
          dVar20 = local_68;
          dVar16 = local_48;
        }
        dVar20 = dVar20 + dVar16 * dVar18;
        local_78 = local_78 + dVar16 * dVar18;
      }
      p_Var13->_M_right = (_Base_ptr)(dVar20 * dVar20 + (double)p_Var13->_M_right);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      _Var7 = this->samplesize_;
      dVar18 = local_88;
    }
    sidx = (int)uVar15;
    dVar20 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[sidx];
    dVar16 = paVar4[iVar1].super_aal_rec.mean_squared;
    paVar4[iVar1].super_aal_rec.mean = dVar20 * local_58 + paVar4[iVar1].super_aal_rec.mean;
    paVar4[iVar1].super_aal_rec.mean_squared = dVar20 * dVar20 * dStack_50 + dVar16;
    if ((this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uStack_60 = 0;
      local_68 = dVar20;
      fillensemblerec(this,sidx,dVar20,dVar18);
      _Var7 = this->samplesize_;
      dVar18 = local_88;
      dVar20 = local_68;
    }
    local_78 = local_78 + dVar20 * dVar18;
    uVar15 = (ulong)(sidx + 1);
  }
  paVar4[iVar1].mean_period = local_78 * local_78 + paVar4[iVar1].mean_period;
  pdVar5 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar12 = (this->vec_sample_sum_loss_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start; pdVar12 != pdVar5; pdVar12 = pdVar12 + 1)
  {
    *pdVar12 = 0.0;
  }
  return;
}

Assistant:

void aalcalc::do_calc_end(const int period_no) {

	// Get weighting
	double weighting = 1;
	double factor = (double)periodstoweighting_.size();
	if (factor > 0) {
		if (periodstoweighting_.find(period_no) != periodstoweighting_.end()) {
			weighting = periodstoweighting_[period_no] * factor;
		} else {
			weighting = 0;
		}
	}

	// There is always an analytical mean
	double mean = vec_sample_sum_loss_[0];
	aal_rec& aa = vec_analytical_aal_[current_summary_id_];
	aa.type = 1;
	aa.summary_id = current_summary_id_;
	aa.mean += mean * weighting;
	aa.mean_squared += mean * mean * weighting;

	aal_rec_period& a_total = vec_sample_aal_[samplesize_][current_summary_id_];
	a_total.type = 2;
	a_total.summary_id = samplesize_ != 0 ? current_summary_id_ : 0;
	double total_mean_by_period = 0;
	auto iter = vec_sample_aal_.begin();
	for (int sidx = 1; sidx < samplesize_ + 1; sidx++) {
		while (iter->first != samplesize_) {
			aal_rec_period& a = iter->second[current_summary_id_];
			double mean_by_period = 0;
			for (sidx = iter->first; sidx < (iter->first << 1); sidx++)
			{
				mean = vec_sample_sum_loss_[sidx];
				a.type = 2;
				a.summary_id = current_summary_id_;
				mean_by_period += mean * weighting;
				a.mean += mean * weighting;
				total_mean_by_period += mean * weighting;
				a_total.mean += mean * weighting;
				a.mean_squared += mean * mean * weighting;
				a_total.mean_squared += mean * mean * weighting;
				if (sidxtoensemble_.size() > 0)
					fillensemblerec(sidx, mean, weighting);
			}
			a.mean_period += mean_by_period * mean_by_period;
			iter++;
		}
		mean = vec_sample_sum_loss_[sidx];
		total_mean_by_period += mean * weighting;
		a_total.mean += mean * weighting;
		a_total.mean_squared += mean * mean * weighting;
		if (sidxtoensemble_.size() > 0)
			fillensemblerec(sidx, mean, weighting);
	}
	a_total.mean_period += total_mean_by_period * total_mean_by_period;

	std::fill(vec_sample_sum_loss_.begin(), vec_sample_sum_loss_.end(), 0.0);

}